

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVectorEnumerator.cpp
# Opt level: O1

void __thiscall JsUtil::FBVEnumerator::MoveToNextBit(FBVEnumerator *this)

{
  BVUnit *pBVar1;
  Type TVar2;
  ulong uVar3;
  long lVar4;
  byte bVar5;
  code *pcVar6;
  bool bVar7;
  uint uVar8;
  undefined4 *puVar9;
  BVUnit *pBVar10;
  
  if ((this->curUnit).word == 0) {
    uVar8 = this->curOffset & 0xffffffc0;
    this->curOffset = uVar8;
    pBVar10 = this->icur;
    pBVar1 = this->iend;
    do {
      uVar8 = uVar8 + 0x40;
      pBVar10 = pBVar10 + 1;
      if (pBVar10 == pBVar1) break;
      TVar2 = pBVar10->word;
      (this->curUnit).word = TVar2;
      this->curOffset = uVar8;
    } while (TVar2 == 0);
    this->icur = pBVar10;
    if (pBVar10 == this->iend) {
      return;
    }
  }
  uVar3 = (this->curUnit).word;
  if (uVar3 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/FixedBitVectorEnumerator.cpp"
                       ,0x34,"(BVInvalidIndex != i)",
                       "Fatal Exception. Error in Bitvector implementation");
    if (!bVar7) {
      pcVar6 = (code *)invalidInstructionException();
      (*pcVar6)();
    }
    *puVar9 = 0;
  }
  lVar4 = 0;
  if (uVar3 != 0) {
    for (; (uVar3 >> lVar4 & 1) == 0; lVar4 = lVar4 + 1) {
    }
  }
  uVar8 = -(uint)(uVar3 == 0) | (uint)lVar4;
  this->curOffset = (this->curOffset & 0xffffffc0) + uVar8;
  BVUnitT<unsigned_long>::AssertRange(uVar8);
  bVar5 = (byte)uVar8 & 0x3f;
  (this->curUnit).word = (this->curUnit).word & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5)
  ;
  return;
}

Assistant:

void
    FBVEnumerator::MoveToNextBit()
    {
        if(curUnit.IsEmpty())
        {
            this->curOffset = BVUnit::Floor(curOffset);
            this->MoveToValidWord();
            if(this->End())
            {
                return;
            }
        }

        BVIndex i = curUnit.GetNextBit();
        AssertMsg(BVInvalidIndex != i, "Fatal Exception. Error in Bitvector implementation");

        curOffset = BVUnit::Floor(curOffset) + i ;
        curUnit.Clear(i);
    }